

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1ac67::
ARTCorrectnessTest_Clear_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTCorrectnessTest_Clear_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  initializer_list<int> absent_keys;
  value_view v;
  const_reference pvVar1;
  node_type_counter_array local_158;
  int local_124;
  iterator local_120;
  undefined8 local_118;
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *local_110;
  pointer local_f8;
  size_t sStackY_f0;
  undefined1 local_e8 [8];
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  ARTCorrectnessTest_Clear_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  verifier.key_views.
  super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  tree_verifier((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)verifier.test_db.root.tagged_ptr,verifier.unused_key._7_1_);
  pvVar1 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  local_f8 = pvVar1->_M_ptr;
  sStackY_f0 = (pvVar1->_M_extent)._M_extent_value;
  v._M_ptr = pvVar1->_M_ptr;
  v._M_extent._M_extent_value = (pvVar1->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  insert<int>((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
               *)local_e8,1,v,false);
  local_110 = (tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
               *)local_e8;
  unodb::test::
  must_not_allocate<(anonymous_namespace)::ARTCorrectnessTest_Clear_Test<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::TestBody()::_lambda()_1_>
            ((anon_class_8_1_710c4454)local_110);
  local_124 = 1;
  local_120 = &local_124;
  local_118 = 1;
  absent_keys._M_len = 1;
  absent_keys._M_array = local_120;
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  check_absent_keys<int>
            ((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_e8,absent_keys);
  local_158._M_elems[0] = 0;
  local_158._M_elems[1] = 0;
  local_158._M_elems[2] = 0;
  local_158._M_elems[3] = 0;
  local_158._M_elems[4] = 0;
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  assert_node_counts((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                      *)local_e8,&local_158);
  unodb::test::
  tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  ~tree_verifier((tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                  *)local_e8);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, Clear) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert(1, test_values[0]);

  unodb::test::must_not_allocate([&verifier] { verifier.clear(); });

  verifier.check_absent_keys({1});

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_node_counts({0, 0, 0, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
}